

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

void __thiscall ring_buffer<int>::push_back(ring_buffer<int> *this,int *value)

{
  value_type vVar1;
  runtime_error *this_00;
  reference pvVar2;
  value_type *in_RSI;
  ulong *in_RDI;
  
  if (*in_RDI == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"ring buffer: capacity is zero");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (in_RDI[1] == *in_RDI) {
    in_RDI[2] = (in_RDI[2] + 1) % *in_RDI;
  }
  else {
    in_RDI[1] = in_RDI[1] + 1;
  }
  vVar1 = *in_RSI;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),in_RDI[3]);
  *pvVar2 = vVar1;
  in_RDI[3] = (in_RDI[3] + 1) % *in_RDI;
  return;
}

Assistant:

void push_back(const T & value) {
        if (capacity == 0) {
            throw std::runtime_error("ring buffer: capacity is zero");
        }

        if (sz == capacity) {
            // advance the start when buffer is full
            first = (first + 1) % capacity;
        } else {
            sz++;
        }
        data[pos] = value;
        pos = (pos + 1) % capacity;
    }